

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isGatherOffsetsCompareResultValid
               (ConstPixelBufferAccess *texture,Sampler *sampler,TexComparePrecision *prec,
               Vec2 *coord,int coordZ,IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  bool bVar1;
  WrapMode WVar2;
  bool isFixedPoint;
  bool bVar3;
  CmpResultSet resultSet;
  int iVar4;
  int iVar5;
  int iVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  int iVar10;
  TextureFormat *format;
  float *pfVar11;
  float fVar12;
  CmpResultSet resSet;
  float depth;
  int y;
  int x;
  int offNdx;
  deInt32 dStack_74;
  bool isCurrentPixelValid;
  int i;
  int j;
  int h;
  int w;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  bool isFixedPointDepth;
  float cmpReference_local;
  IVec2 (*offsets_local) [4];
  int coordZ_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *texture_local;
  
  format = ConstPixelBufferAccess::getFormat(texture);
  isFixedPoint = isFixedPointDepthTextureFormat(format);
  bVar1 = sampler->normalizedCoords;
  iVar4 = ConstPixelBufferAccess::getWidth(texture);
  fVar12 = Vector<float,_2>::x(coord);
  iVar5 = Vector<int,_3>::x(&prec->coordBits);
  iVar6 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar1 & 1),iVar4,fVar12,iVar5,iVar6);
  bVar1 = sampler->normalizedCoords;
  iVar4 = ConstPixelBufferAccess::getHeight(texture);
  fVar12 = Vector<float,_2>::y(coord);
  iVar5 = Vector<int,_3>::y(&prec->coordBits);
  iVar6 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar4,fVar12,iVar5,iVar6);
  fVar12 = Vector<float,_2>::x(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y(&vBounds);
  dVar8 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  dStack_74 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar9 = deFloorFloatToInt32(fVar12 - 0.5);
  iVar4 = ConstPixelBufferAccess::getWidth(texture);
  iVar5 = ConstPixelBufferAccess::getHeight(texture);
  do {
    offNdx = dVar7;
    if (dVar9 < dStack_74) {
      return false;
    }
    for (; offNdx <= dVar8; offNdx = offNdx + 1) {
      bVar1 = true;
      y = 0;
      while( true ) {
        bVar3 = false;
        if (y < 4) {
          bVar3 = bVar1;
        }
        if (!bVar3) break;
        WVar2 = sampler->wrapS;
        iVar6 = Vector<int,_2>::x(*offsets + y);
        iVar6 = TexVerifierUtil::wrap(WVar2,offNdx + iVar6,iVar4);
        WVar2 = sampler->wrapT;
        iVar10 = Vector<int,_2>::y(*offsets + y);
        iVar10 = TexVerifierUtil::wrap(WVar2,dStack_74 + iVar10,iVar5);
        fVar12 = lookupDepth(texture,sampler,iVar6,iVar10,coordZ);
        resultSet = execCompare(sampler->compare,fVar12,cmpReference,prec->referenceBits,
                                isFixedPoint);
        pfVar11 = Vector<float,_4>::operator[](result,y);
        bVar3 = isResultInSet(resultSet,*pfVar11,prec->resultBits);
        if (!bVar3) {
          bVar1 = false;
        }
        y = y + 1;
      }
      if (bVar1) {
        return true;
      }
    }
    dStack_74 = dStack_74 + 1;
  } while( true );
}

Assistant:

static bool isGatherOffsetsCompareResultValid (const ConstPixelBufferAccess&	texture,
											   const Sampler&					sampler,
											   const TexComparePrecision&		prec,
											   const Vec2&						coord,
											   int								coordZ,
											   const IVec2						(&offsets)[4],
											   float							cmpReference,
											   const Vec4&						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getWidth(),		coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w					= texture.getWidth();
	const int	h					= texture.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			bool isCurrentPixelValid = true;

			for (int offNdx = 0; offNdx < 4 && isCurrentPixelValid; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int			x		= wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int			y		= wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				const float			depth	= lookupDepth(texture, sampler, x, y, coordZ);
				const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

				if (!isResultInSet(resSet, result[offNdx], prec.resultBits))
					isCurrentPixelValid = false;
			}

			if (isCurrentPixelValid)
				return true;
		}
	}

	return false;
}